

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbisetb.cpp
# Opt level: O2

void __thiscall icu_63::RBBISetBuilder::buildRanges(RBBISetBuilder *this)

{
  RangeDescriptor **ppRVar1;
  UnicodeSet *pUVar2;
  RangeDescriptor *pRVar3;
  UBool UVar4;
  int32_t iVar5;
  UChar32 where;
  UChar32 UVar6;
  int32_t iVar7;
  RangeDescriptor *pRVar8;
  void *obj;
  RBBINode *usetNode;
  int32_t iVar9;
  RangeDescriptor **ppRVar10;
  size_t in_RSI;
  int iVar11;
  UnicodeString bofString;
  UnicodeString eofString;
  
  pRVar8 = (RangeDescriptor *)UMemory::operator_new((UMemory *)0x20,in_RSI);
  if (pRVar8 == (RangeDescriptor *)0x0) {
    this->fRangeList = (RangeDescriptor *)0x0;
    *this->fStatus = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    RangeDescriptor::RangeDescriptor(pRVar8,this->fStatus);
    this->fRangeList = pRVar8;
    pRVar8->fStartChar = 0;
    pRVar8->fEndChar = 0x10ffff;
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      ppRVar1 = &this->fRangeList;
      iVar9 = 0;
LAB_0030765e:
      obj = UVector::elementAt(this->fRB->fUSetNodes,iVar9);
      ppRVar10 = ppRVar1;
      if (obj == (void *)0x0) {
        while (pRVar8 = *ppRVar10, ppRVar10 = ppRVar1, pRVar8 != (RangeDescriptor *)0x0) {
          while (pRVar3 = *ppRVar10, pRVar3 != pRVar8) {
            UVar4 = UVector::equals(pRVar8->fIncludesSets,pRVar3->fIncludesSets);
            if (UVar4 != '\0') {
              iVar9 = pRVar3->fNum;
              pRVar8->fNum = iVar9;
              goto LAB_003077cd;
            }
            ppRVar10 = &pRVar3->fNext;
          }
          iVar9 = pRVar8->fNum;
LAB_003077cd:
          if (iVar9 == 0) {
            iVar11 = this->fGroupCount;
            this->fGroupCount = iVar11 + 1;
            pRVar8->fNum = iVar11 + 3;
            RangeDescriptor::setDictionaryFlag(pRVar8);
            addValToSets(this,pRVar8->fIncludesSets,this->fGroupCount + 2);
          }
          ppRVar10 = &pRVar8->fNext;
        }
        icu_63::UnicodeString::UnicodeString(&eofString,L"eof");
        icu_63::UnicodeString::UnicodeString(&bofString,L"bof");
        iVar11 = 0;
        while (usetNode = (RBBINode *)UVector::elementAt(this->fRB->fUSetNodes,iVar11),
              usetNode != (RBBINode *)0x0) {
          pUVar2 = usetNode->fInputSet;
          UVar4 = UnicodeSet::contains(pUVar2,&eofString);
          if (UVar4 != '\0') {
            addValToSet(this,usetNode,1);
          }
          UVar4 = UnicodeSet::contains(pUVar2,&bofString);
          if (UVar4 != '\0') {
            addValToSet(this,usetNode,2);
            this->fSawBOF = '\x01';
          }
          iVar11 = iVar11 + 1;
        }
        icu_63::UnicodeString::~UnicodeString(&bofString);
        icu_63::UnicodeString::~UnicodeString(&eofString);
      }
      else {
        pUVar2 = *(UnicodeSet **)((long)obj + 0x20);
        iVar5 = UnicodeSet::getRangeCount(pUVar2);
        iVar11 = 0;
        while( true ) {
          pRVar8 = *ppRVar10;
          while( true ) {
            if (iVar5 <= iVar11) {
              iVar9 = iVar9 + 1;
              goto LAB_0030765e;
            }
            where = UnicodeSet::getRangeStart(pUVar2,iVar11);
            UVar6 = UnicodeSet::getRangeEnd(pUVar2,iVar11);
            for (; pRVar8->fEndChar < where; pRVar8 = pRVar8->fNext) {
            }
            if (where <= pRVar8->fStartChar) break;
            RangeDescriptor::split(pRVar8,where,this->fStatus);
            if (U_ZERO_ERROR < *this->fStatus) {
              return;
            }
          }
          if (((UVar6 < pRVar8->fEndChar) &&
              (RangeDescriptor::split(pRVar8,UVar6 + 1,this->fStatus), U_ZERO_ERROR < *this->fStatus
              )) || ((iVar7 = UVector::indexOf(pRVar8->fIncludesSets,obj,0), iVar7 == -1 &&
                     (UVector::addElement(pRVar8->fIncludesSets,obj,this->fStatus),
                     U_ZERO_ERROR < *this->fStatus)))) break;
          iVar11 = iVar11 + (uint)(UVar6 == pRVar8->fEndChar);
          ppRVar10 = &pRVar8->fNext;
        }
      }
    }
  }
  return;
}

Assistant:

void RBBISetBuilder::buildRanges() {
    RBBINode        *usetNode;
    RangeDescriptor *rlRange;

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "usets")) {printSets();}

    //
    //  Initialize the process by creating a single range encompassing all characters
    //  that is in no sets.
    //
    fRangeList                = new RangeDescriptor(*fStatus); // will check for status here
    if (fRangeList == NULL) {
        *fStatus = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fRangeList->fStartChar    = 0;
    fRangeList->fEndChar      = 0x10ffff;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    //
    //  Find the set of non-overlapping ranges of characters
    //
    int  ni;
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }

        UnicodeSet      *inputSet             = usetNode->fInputSet;
        int32_t          inputSetRangeCount   = inputSet->getRangeCount();
        int              inputSetRangeIndex   = 0;
                         rlRange              = fRangeList;

        for (;;) {
            if (inputSetRangeIndex >= inputSetRangeCount) {
                break;
            }
            UChar32      inputSetRangeBegin  = inputSet->getRangeStart(inputSetRangeIndex);
            UChar32      inputSetRangeEnd    = inputSet->getRangeEnd(inputSetRangeIndex);

            // skip over ranges from the range list that are completely
            //   below the current range from the input unicode set.
            while (rlRange->fEndChar < inputSetRangeBegin) {
                rlRange = rlRange->fNext;
            }

            // If the start of the range from the range list is before with
            //   the start of the range from the unicode set, split the range list range
            //   in two, with one part being before (wholly outside of) the unicode set
            //   and the other containing the rest.
            //   Then continue the loop; the post-split current range will then be skipped
            //     over
            if (rlRange->fStartChar < inputSetRangeBegin) {
                rlRange->split(inputSetRangeBegin, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
                continue;
            }

            // Same thing at the end of the ranges...
            // If the end of the range from the range list doesn't coincide with
            //   the end of the range from the unicode set, split the range list
            //   range in two.  The first part of the split range will be
            //   wholly inside the Unicode set.
            if (rlRange->fEndChar > inputSetRangeEnd) {
                rlRange->split(inputSetRangeEnd+1, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // The current rlRange is now entirely within the UnicodeSet range.
            // Add this unicode set to the list of sets for this rlRange
            if (rlRange->fIncludesSets->indexOf(usetNode) == -1) {
                rlRange->fIncludesSets->addElement(usetNode, *fStatus);
                if (U_FAILURE(*fStatus)) {
                    return;
                }
            }

            // Advance over ranges that we are finished with.
            if (inputSetRangeEnd == rlRange->fEndChar) {
                inputSetRangeIndex++;
            }
            rlRange = rlRange->fNext;
        }
    }

    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "range")) { printRanges();}

    //
    //  Group the above ranges, with each group consisting of one or more
    //    ranges that are in exactly the same set of original UnicodeSets.
    //    The groups are numbered, and these group numbers are the set of
    //    input symbols recognized by the run-time state machine.
    //
    //    Numbering: # 0  (state table column 0) is unused.
    //               # 1  is reserved - table column 1 is for end-of-input
    //               # 2  is reserved - table column 2 is for beginning-in-input
    //               # 3  is the first range list.
    //
    RangeDescriptor *rlSearchRange;
    for (rlRange = fRangeList; rlRange!=0; rlRange=rlRange->fNext) {
        for (rlSearchRange=fRangeList; rlSearchRange != rlRange; rlSearchRange=rlSearchRange->fNext) {
            if (rlRange->fIncludesSets->equals(*rlSearchRange->fIncludesSets)) {
                rlRange->fNum = rlSearchRange->fNum;
                break;
            }
        }
        if (rlRange->fNum == 0) {
            fGroupCount ++;
            rlRange->fNum = fGroupCount+2; 
            rlRange->setDictionaryFlag();
            addValToSets(rlRange->fIncludesSets, fGroupCount+2);
        }
    }

    // Handle input sets that contain the special string {eof}.
    //   Column 1 of the state table is reserved for EOF on input.
    //   Column 2 is reserved for before-the-start-input.
    //            (This column can be optimized away later if there are no rule
    //             references to {bof}.)
    //   Add this column value (1 or 2) to the equivalent expression
    //     subtree for each UnicodeSet that contains the string {eof}
    //   Because {bof} and {eof} are not a characters in the normal sense,
    //   they doesn't affect the computation of ranges or TRIE.
    static const UChar eofUString[] = {0x65, 0x6f, 0x66, 0};
    static const UChar bofUString[] = {0x62, 0x6f, 0x66, 0};

    UnicodeString eofString(eofUString);
    UnicodeString bofString(bofUString);
    for (ni=0; ; ni++) {        // Loop over each of the UnicodeSets encountered in the input rules
        usetNode = (RBBINode *)this->fRB->fUSetNodes->elementAt(ni);
        if (usetNode==NULL) {
            break;
        }
        UnicodeSet      *inputSet = usetNode->fInputSet;
        if (inputSet->contains(eofString)) {
            addValToSet(usetNode, 1);
        }
        if (inputSet->contains(bofString)) {
            addValToSet(usetNode, 2);
            fSawBOF = TRUE;
        }
    }


    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "rgroup")) {printRangeGroups();}
    if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "esets")) {printSets();}
}